

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall yactfr::internal::JsonErtFragValReq::JsonErtFragValReq(JsonErtFragValReq *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  __l;
  char *pcVar1;
  bool isRequired;
  bool isRequired_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_308;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  local_2a5;
  key_equal local_2a4;
  hasher local_2a3;
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  JsonValKind local_254;
  type local_250;
  undefined1 local_248 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_218;
  PropReqsEntry local_1e0;
  PropReqsEntry local_1a8;
  undefined1 local_170 [56];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_138;
  PropReqsEntry local_100;
  PropReqsEntry local_c8;
  iterator local_90;
  size_type local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  local_80;
  allocator local_31;
  string local_30;
  JsonErtFragValReq *local_10;
  JsonErtFragValReq *this_local;
  
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonErtFragValReq_007e0420;
  local_10 = this;
  pcVar1 = typeStr();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  local_2a2 = 1;
  local_220 = &local_218;
  (anonymous_namespace)::nsPropReqEntry_abi_cxx11_();
  local_220 = &local_1e0;
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_
            (local_220,(_anonymous_namespace_ *)0x0,isRequired);
  local_220 = &local_1a8;
  (anonymous_namespace)::uidPropReqEntry_abi_cxx11_
            (local_220,(_anonymous_namespace_ *)0x0,isRequired_00);
  local_220 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)local_170;
  (anonymous_namespace)::idPropReqEntry_abi_cxx11_();
  local_254 = UInt;
  local_220 = &local_138;
  boost::optional<yactfr::internal::JsonValKind>::optional
            ((optional<yactfr::internal::JsonValKind> *)&local_250,&local_254);
  JsonValReq::shared((JsonValReq *)local_248,(optional<yactfr::internal::JsonValKind>)local_250,
                     false);
  JsonObjValPropReq::JsonObjValPropReq
            ((JsonObjValPropReq *)(local_248 + 0x10),(Sp *)local_248,false);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>(&local_138,&strs::dscId,(JsonObjValPropReq *)(local_248 + 0x10))
  ;
  local_220 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"specific-context-field-class",&local_279);
  anon_unknown_0::anyDtPropReqEntry(&local_100,&local_278,&this->_anyFullDtValReq,false);
  local_220 = &local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"payload-field-class",&local_2a1);
  anon_unknown_0::anyDtPropReqEntry(&local_c8,&local_2a0,&this->_anyFullDtValReq,false);
  local_2a2 = 0;
  local_90 = &local_218;
  local_88 = 7;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::allocator(&local_2a5);
  __l._M_len = local_88;
  __l._M_array = local_90;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::unordered_map(&local_80,__l,0,&local_2a3,&local_2a4,&local_2a5);
  JsonFragValReq::JsonFragValReq(&this->super_JsonFragValReq,&local_30,&local_80);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::~unordered_map(&local_80);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::~allocator(&local_2a5);
  local_308 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)&local_90;
  do {
    local_308 = local_308 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair(local_308);
  } while (local_308 != &local_218);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  JsonObjValPropReq::~JsonObjValPropReq((JsonObjValPropReq *)(local_248 + 0x10));
  std::shared_ptr<const_yactfr::internal::JsonValReq>::~shared_ptr
            ((shared_ptr<const_yactfr::internal::JsonValReq> *)local_248);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonErtFragValReq_007e0420;
  JsonAnyFullDtValReq::JsonAnyFullDtValReq(&this->_anyFullDtValReq);
  return;
}

Assistant:

explicit JsonErtFragValReq() :
        JsonFragValReq {this->typeStr(), {
            nsPropReqEntry(),
            namePropReqEntry(false),
            uidPropReqEntry(false),
            idPropReqEntry(),
            {strs::dscId, {JsonValReq::shared(JsonVal::Kind::UInt)}},
            anyDtPropReqEntry(strs::specCtxFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::payloadFc, _anyFullDtValReq), //-V1050
        }}
    {
    }